

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::x86::
     perform<(InstructionSet::x86::DataSize)1,(InstructionSet::x86::AddressSize)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,Context *context)

{
  Operation OVar1;
  bool bVar2;
  uint8_t uVar3;
  Source SVar4;
  read_t<IntT>_conflict rVar5;
  read_t<IntT>_conflict rVar6;
  DisplacementT offset;
  ImmediateT IVar7;
  uint16_t uVar8;
  unsigned_short value;
  RegisterPair16 *pRVar9;
  IntT *pIVar10;
  IntT *pIVar11;
  modify_t<IntT>_conflict puVar12;
  modify_t<IntT>_conflict source;
  uint8_t *puVar13;
  AddressT *pAVar14;
  AddressT *pAVar15;
  uint16_t *puVar16;
  AddressT *pAVar17;
  Context *__stat_loc;
  DataPointer local_152;
  Writeable<unsigned_short> local_150;
  write_t<unsigned_short> local_148;
  DataPointer local_13c;
  DataPointer local_13a;
  unsigned_short *local_138;
  unsigned_short *local_130;
  DataPointer local_122;
  write_t<unsigned_short> local_120;
  unsigned_short *local_118;
  unsigned_short *local_110;
  unsigned_short *local_108;
  Instruction<false> local_100;
  Instruction<false> local_f8;
  undefined1 local_f0 [8];
  anon_class_16_2_abe5e74a port;
  anon_class_8_1_bc11688f eCX;
  anon_class_8_1_bc11688f eDI;
  anon_class_8_1_bc11688f eSI;
  anon_class_8_1_bc11688f pair_low;
  anon_class_8_1_bc11688f pair_high;
  anon_class_16_2_abe5e74a shift_count;
  anon_class_16_2_abe5e74a jcc;
  anon_class_24_3_3125e587 destination_rmw;
  anon_class_24_3_3125e587 destination_w;
  anon_class_24_3_3125e587 destination_r;
  anon_class_24_3_3125e587 source_rmw;
  anon_class_24_3_3125e587 source_r;
  IntT immediate;
  Context *context_local;
  Instruction<false> *instruction_local;
  
  destination_rmw.context = (Context *)((long)&source_r.immediate + 6);
  __stat_loc = context;
  local_f0 = (undefined1  [8])instruction;
  port.instruction = (Instruction<false> *)context;
  port.context = context;
  eCX.context = context;
  eDI.context = context;
  eSI.context = context;
  pair_low.context = context;
  pair_high.context = (Context *)instruction;
  shift_count.instruction = (Instruction<false> *)context;
  shift_count.context = (Context *)instruction;
  jcc.instruction = (Instruction<false> *)context;
  jcc.context = (Context *)instruction;
  destination_rmw.instruction = (Instruction<false> *)context;
  destination_rmw.immediate = (IntT *)instruction;
  destination_w.instruction = (Instruction<false> *)context;
  destination_w.context = destination_rmw.context;
  destination_w.immediate = (IntT *)instruction;
  destination_r.instruction = (Instruction<false> *)context;
  destination_r.context = destination_rmw.context;
  destination_r.immediate = (IntT *)instruction;
  source_rmw.instruction = (Instruction<false> *)context;
  source_rmw.context = destination_rmw.context;
  source_rmw.immediate = (IntT *)instruction;
  source_r.instruction = (Instruction<false> *)context;
  source_r.context = destination_rmw.context;
  OVar1 = Instruction<false>::operation(instruction);
  switch(OVar1) {
  case Invalid:
  case ESC:
  case NOP:
    break;
  case AAA:
    pRVar9 = PCCompatible::Registers::axp(&context->registers);
    Primitive::
    aaas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pRVar9,context);
    break;
  case AAD:
    pRVar9 = PCCompatible::Registers::axp(&context->registers);
    IVar7 = Instruction<false>::operand(instruction);
    Primitive::
    aad<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pRVar9,(uint8_t)IVar7,context);
    break;
  case AAM:
    pRVar9 = PCCompatible::Registers::axp(&context->registers);
    IVar7 = Instruction<false>::operand(instruction);
    Primitive::
    aam<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pRVar9,(uint8_t)IVar7,context);
    break;
  case AAS:
    pRVar9 = PCCompatible::Registers::axp(&context->registers);
    Primitive::
    aaas<false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pRVar9,context);
    break;
  case DAA:
    puVar13 = PCCompatible::Registers::al(&context->registers);
    Primitive::
    daas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar13,context);
    break;
  case DAS:
    puVar13 = PCCompatible::Registers::al(&context->registers);
    Primitive::
    daas<false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar13,context);
    break;
  case CBW:
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::cbw<unsigned_short>(pIVar10);
    break;
  case CWD:
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&pair_low);
    pIVar11 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::cwd<unsigned_short>(pIVar10,*pIVar11);
    break;
  case HLT:
    PCCompatible::FlowController::halt(&context->flow_controller);
    break;
  case WAIT:
    PCCompatible::FlowController::wait(&context->flow_controller,__stat_loc);
    break;
  case ADC:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    add<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,rVar6,context);
    goto LAB_007d9927;
  case ADD:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    add<false,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,rVar6,context);
    goto LAB_007d9927;
  case SBB:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    sub<true,(InstructionSet::x86::AccessType)2,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,rVar6,context);
    goto LAB_007d9927;
  case SUB:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    sub<false,(InstructionSet::x86::AccessType)2,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,rVar6,context);
    goto LAB_007d9927;
  case MUL:
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&pair_low);
    pIVar11 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    mul<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pIVar10,pIVar11,rVar6,context);
    break;
  case IMUL_1:
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&pair_low);
    pIVar11 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    imul<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pIVar10,pIVar11,rVar6,context);
    break;
  case DIV:
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&pair_low);
    pIVar11 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    div<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pIVar10,pIVar11,rVar6,context);
    break;
  case IDIV:
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&pair_low);
    pIVar11 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    idiv<false,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pIVar10,pIVar11,rVar6,context);
    break;
  case INC:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    Primitive::
    inc<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,context);
    goto LAB_007d9927;
  case DEC:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    Primitive::
    dec<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,context);
    goto LAB_007d9927;
  case IN:
    local_13c = Instruction<false>::source(instruction);
    SVar4 = DataPointer::source(&local_13c);
    uVar8 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)local_f0,SVar4);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Writeable<unsigned_short>::Writeable(&local_148,pIVar10);
    Primitive::
    in<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (uVar8,local_148,context);
    break;
  case OUT:
    local_13a = Instruction<false>::destination(instruction);
    SVar4 = DataPointer::source(&local_13a);
    uVar8 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)local_f0,SVar4);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    out<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (uVar8,*pIVar10,context);
    break;
  case JO:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)0>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JNO:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)0>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case JB:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)1>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JNB:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)1>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case JZ:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)2>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JNZ:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)2>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case JBE:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)3>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JNBE:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)3>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case JS:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)4>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JNS:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)4>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case JP:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)5>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case JNP:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)5>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JL:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)6>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JNL:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)6>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case JLE:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)7>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,bVar2);
    break;
  case JNLE:
    bVar2 = Flags::condition<(InstructionSet::x86::Condition)7>(&context->flags);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((bVar2 ^ 0xffU) & 1));
    break;
  case CALLabs:
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&destination_w.immediate);
    Primitive::
    call_absolute<unsigned_short,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (rVar6,context);
    break;
  case CALLrel:
    offset = Instruction<false>::displacement(instruction);
    Primitive::
    call_relative<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (offset,context);
    break;
  case CALLfar:
    Primitive::
    call_far<unsigned_short,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,context);
    break;
  case IRET:
    Primitive::
    iret<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case RETfar:
    local_100 = *instruction;
    Primitive::
    ret_far<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (local_100,context);
    break;
  case RETnear:
    local_f8 = *instruction;
    Primitive::
    ret_near<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (local_f8,context);
    break;
  case JMPabs:
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&destination_w.immediate);
    Primitive::
    jump_absolute<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (rVar6,context);
    break;
  case JMPrel:
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&shift_count.context,true);
    break;
  case JMPfar:
    Primitive::
    jump_far<InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,context);
    break;
  case JCXZ:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()
              ((anon_class_16_2_abe5e74a *)&shift_count.context,(bool)((*pAVar15 != 0 ^ 0xffU) & 1))
    ;
    break;
  case INT:
    IVar7 = Instruction<false>::operand(instruction);
    interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ((uint)IVar7,context);
    break;
  case INTO:
    Primitive::
    into<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case LAHF:
    puVar13 = PCCompatible::Registers::ah(&context->registers);
    Primitive::
    lahf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar13,context);
    break;
  case SAHF:
    puVar13 = PCCompatible::Registers::ah(&context->registers);
    Primitive::
    sahf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar13,context);
    break;
  case LDS:
    local_108 = (unsigned_short *)
                perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                ::anon_class_24_3_3125e587::operator()
                          ((anon_class_24_3_3125e587 *)&destination_rmw.immediate);
    Primitive::
    ld<(InstructionSet::x86::Source)11,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,(write_t<uint16_t>)local_108,context);
    PCCompatible::Segments::did_update(&context->segments,DS);
    break;
  case LES:
    local_110 = (unsigned_short *)
                perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                ::anon_class_24_3_3125e587::operator()
                          ((anon_class_24_3_3125e587 *)&destination_rmw.immediate);
    Primitive::
    ld<(InstructionSet::x86::Source)8,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,(write_t<uint16_t>)local_110,context);
    PCCompatible::Segments::did_update(&context->segments,ES);
    break;
  case LEA:
    local_118 = (unsigned_short *)
                perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                ::anon_class_24_3_3125e587::operator()
                          ((anon_class_24_3_3125e587 *)&destination_rmw.immediate);
    Primitive::
    lea<unsigned_short,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,(write_t<unsigned_short>)local_118,context);
    break;
  case MOVS:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    pAVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    Primitive::
    movs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,pAVar17,pAVar14,context);
    goto LAB_007d9927;
  case MOVS_REP:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    pAVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    Primitive::
    movs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,pAVar17,pAVar14,context);
    goto LAB_007d9927;
  case LODS:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    lods<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,pAVar17,pIVar10,context);
    break;
  case LODS_REP:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    lods<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,pAVar17,pIVar10,context);
    break;
  case STOS:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    stos<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,pAVar17,pIVar10,context);
    goto LAB_007d9927;
  case STOS_REP:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    stos<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,pAVar17,pIVar10,context);
    goto LAB_007d9927;
  case CMPS:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    pAVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    Primitive::
    cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,pAVar17,pAVar14,context);
    break;
  case CMPS_REPE:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    pAVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    Primitive::
    cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)1,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,pAVar17,pAVar14,context);
    break;
  case CMPS_REPNE:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    pAVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    Primitive::
    cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)2,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,pAVar17,pAVar14,context);
    break;
  case SCAS:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    scas<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,pAVar17,pIVar10,context);
    break;
  case SCAS_REPE:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    scas<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)1,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,pAVar17,pIVar10,context);
    break;
  case SCAS_REPNE:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    Primitive::
    scas<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)2,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,pAVar17,pIVar10,context);
    break;
  case LOOP:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    IVar7 = Instruction<false>::offset(instruction);
    Primitive::
    loop<unsigned_short,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,IVar7,context);
    break;
  case LOOPE:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    IVar7 = Instruction<false>::offset(instruction);
    Primitive::
    loope<unsigned_short,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,IVar7,context);
    break;
  case LOOPNE:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    IVar7 = Instruction<false>::offset(instruction);
    Primitive::
    loopne<unsigned_short,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,IVar7,context);
    break;
  case MOV:
    local_120.target_ =
         (unsigned_short *)
         perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
         ::anon_class_24_3_3125e587::operator()
                   ((anon_class_24_3_3125e587 *)&destination_rmw.immediate);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::mov<unsigned_short>(local_120,rVar6);
    local_122 = Instruction<false>::destination(instruction);
    SVar4 = DataPointer::source(&local_122);
    PCCompatible::Segments::did_update(&context->segments,SVar4);
    goto LAB_007d9927;
  case NEG:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()
                        ((anon_class_24_3_3125e587 *)&destination_r.immediate);
    Primitive::
    neg<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,context);
    goto LAB_007d9927;
  case NOT:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()
                        ((anon_class_24_3_3125e587 *)&destination_r.immediate);
    Primitive::not_<unsigned_short>(puVar12);
    goto LAB_007d9927;
  case AND:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    and_<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,rVar6,context);
    goto LAB_007d9927;
  case OR:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    or_<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,rVar6,context);
    goto LAB_007d9927;
  case XOR:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    xor_<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,rVar6,context);
    goto LAB_007d9927;
  case POP:
    value = Primitive::
            pop<unsigned_short,false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (context);
    local_150.target_ =
         (unsigned_short *)
         perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
         ::anon_class_24_3_3125e587::operator()
                   ((anon_class_24_3_3125e587 *)&destination_rmw.immediate);
    Writeable<unsigned_short>::operator=(&local_150,value);
    local_152 = Instruction<false>::destination(instruction);
    SVar4 = DataPointer::source(&local_152);
    PCCompatible::Segments::did_update(&context->segments,SVar4);
    goto LAB_007d9927;
  case POPF:
    Primitive::
    popf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case PUSH:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()
                        ((anon_class_24_3_3125e587 *)&destination_r.immediate);
    Primitive::
    push<unsigned_short,false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,context);
    goto LAB_007d9927;
  case PUSHF:
    Primitive::
    pushf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case RCL:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    uVar3 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&pair_high);
    Primitive::
    rcl<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,uVar3,context);
    goto LAB_007d9927;
  case RCR:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    uVar3 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&pair_high);
    Primitive::
    rcr<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,uVar3,context);
    goto LAB_007d9927;
  case ROL:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    uVar3 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&pair_high);
    Primitive::
    rol<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,uVar3,context);
    goto LAB_007d9927;
  case ROR:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    uVar3 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&pair_high);
    Primitive::
    ror<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,uVar3,context);
    goto LAB_007d9927;
  case SAL:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    uVar3 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&pair_high);
    Primitive::
    sal<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,uVar3,context);
    goto LAB_007d9927;
  case SAR:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    uVar3 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&pair_high);
    Primitive::
    sar<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,uVar3,context);
    goto LAB_007d9927;
  case SHR:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    uVar3 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()((anon_class_16_2_abe5e74a *)&pair_high);
    Primitive::
    shr<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar12,uVar3,context);
    goto LAB_007d9927;
  case CLC:
    Primitive::
    clc<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case CLD:
    Primitive::
    cld<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case CLI:
    Primitive::
    cli<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case STC:
    Primitive::
    stc<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case STD:
    Primitive::
    std<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case STI:
    Primitive::
    sti<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case CMC:
    Primitive::
    cmc<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case CMP:
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&destination_w.immediate);
    rVar5 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    sub<false,(InstructionSet::x86::AccessType)0,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (rVar6,rVar5,context);
    break;
  case TEST:
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&destination_w.immediate);
    rVar5 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    test<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (rVar6,rVar5,context);
    break;
  case XCHG:
    puVar12 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()((anon_class_24_3_3125e587 *)&jcc.context);
    source = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()
                       ((anon_class_24_3_3125e587 *)&destination_r.immediate);
    Primitive::xchg<unsigned_short>(puVar12,source);
    goto LAB_007d9927;
  case XLAT:
    Primitive::
    xlat<unsigned_short,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,context);
    break;
  case SALC:
    puVar13 = PCCompatible::Registers::al(&context->registers);
    Primitive::
    salc<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar13,context);
    break;
  case BOUND:
    puVar13 = PCCompatible::Registers::cl(&context->registers);
    if (*puVar13 != '\0') {
      local_138 = (unsigned_short *)
                  perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                  ::anon_class_24_3_3125e587::operator()
                            ((anon_class_24_3_3125e587 *)&destination_rmw.immediate);
      Primitive::
      setmo<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                ((write_t<unsigned_short>)local_138,context);
    }
    goto LAB_007d9927;
  case ENTER:
    local_130 = (unsigned_short *)
                perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                ::anon_class_24_3_3125e587::operator()
                          ((anon_class_24_3_3125e587 *)&destination_rmw.immediate);
    Primitive::
    setmo<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ((write_t<unsigned_short>)local_130,context);
    goto LAB_007d9927;
  case IDIV_REP:
    pIVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&pair_low);
    pIVar11 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eSI);
    rVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()
                      ((anon_class_24_3_3125e587 *)&source_rmw.immediate);
    Primitive::
    idiv<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pIVar10,pIVar11,rVar6,context);
    goto LAB_007d9927;
  case INS:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    puVar16 = PCCompatible::Registers::dx(&context->registers);
    uVar8 = *puVar16;
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    Primitive::
    ins<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,uVar8,pAVar17,context);
    goto LAB_007d9927;
  case INS_REP:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    puVar16 = PCCompatible::Registers::dx(&context->registers);
    uVar8 = *puVar16;
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eCX);
    Primitive::
    ins<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (pAVar15,uVar8,pAVar17,context);
LAB_007d9927:
    PCCompatible::Memory::write_back<unsigned_short>(&context->memory);
    break;
  case OUTS:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    puVar16 = PCCompatible::Registers::dx(&context->registers);
    uVar8 = *puVar16;
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    Primitive::
    outs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,uVar8,pAVar17,context);
    break;
  case OUTS_REP:
    pAVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()((anon_class_8_1_bc11688f *)&port.context);
    puVar16 = PCCompatible::Registers::dx(&context->registers);
    uVar8 = *puVar16;
    pAVar17 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_8_1_bc11688f::operator()(&eDI);
    Primitive::
    outs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,pAVar15,uVar8,pAVar17,context);
    break;
  case PUSHA:
    Primitive::
    pusha<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case POPA:
    Primitive::
    popa<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/PCCompatible/../../InstructionSets/x86/Implementation/PerformImplementation.hpp"
                  ,0xac,
                  "void InstructionSet::x86::perform(const InstructionT &, ContextT &) [data_size = InstructionSet::x86::DataSize::Word, address_size = InstructionSet::x86::AddressSize::b16, InstructionT = InstructionSet::x86::Instruction<false>, ContextT = PCCompatible::ConcreteMachine<Analyser::Static::PCCompatible::Target::VideoAdaptor::MDA>::Context]"
                 );
  }
  return;
}

Assistant:

void perform(
	const InstructionT &instruction,
	ContextT &context
) {
	using IntT = typename DataSizeType<data_size>::type;
	using AddressT = typename AddressSizeType<address_size>::type;

	// Establish source() and destination() shorthands to fetch data if necessary.
	//
	// C++17, which this project targets at the time of writing, does not provide templatised lambdas.
	// So the following division is in part a necessity.
	//
	// (though GCC offers C++20 syntax as an extension, and Clang seems to follow along, so maybe I'm overthinking)
	IntT immediate;
	const auto source_r = [&]() -> read_t<IntT> {
		return resolve<IntT, AccessType::Read>(
			instruction,
			instruction.source().source(),
			instruction.source(),
			context,
			nullptr,
			&immediate);
	};
	const auto source_rmw = [&]() -> modify_t<IntT> {
		return resolve<IntT, AccessType::ReadModifyWrite>(
			instruction,
			instruction.source().source(),
			instruction.source(),
			context,
			nullptr,
			&immediate);
	};
	const auto destination_r = [&]() -> read_t<IntT> {
		return resolve<IntT, AccessType::Read>(
			instruction,
			instruction.destination().source(),
			instruction.destination(),
			context,
			nullptr,
			&immediate);
	};
	const auto destination_w = [&]() -> write_t<IntT> {
		return resolve<IntT, AccessType::Write>(
			instruction,
			instruction.destination().source(),
			instruction.destination(),
			context,
			nullptr,
			&immediate);
	};
	const auto destination_rmw = [&]() -> modify_t<IntT> {
		return resolve<IntT, AccessType::ReadModifyWrite>(
			instruction,
			instruction.destination().source(),
			instruction.destination(),
			context,
			nullptr,
			&immediate);
	};

	// Performs a displacement jump only if @c condition is true.
	const auto jcc = [&](bool condition) {
		Primitive::jump(
			condition,
			instruction.displacement(),
			context);
	};

	const auto shift_count = [&]() -> uint8_t {
		static constexpr uint8_t mask = (ContextT::model != Model::i8086) ? 0x1f : 0xff;
		switch(instruction.source().source()) {
			case Source::None:		return 1;
			case Source::Immediate:	return uint8_t(instruction.operand()) & mask;
			default:				return context.registers.cl() & mask;
		}
	};

	// Some instructions use a pair of registers as an extended accumulator — DX:AX or EDX:EAX.
	// The two following return the high and low parts of that pair; they also work in Byte mode to return AH:AL,
	// i.e. AX split into high and low parts.
	const auto pair_high = [&]() -> IntT& {
		if constexpr (data_size == DataSize::Byte) 			return context.registers.ah();
		else if constexpr (data_size == DataSize::Word)		return context.registers.dx();
		else if constexpr (data_size == DataSize::DWord)	return context.registers.edx();
	};
	const auto pair_low = [&]() -> IntT& {
		if constexpr (data_size == DataSize::Byte) 			return context.registers.al();
		else if constexpr (data_size == DataSize::Word)		return context.registers.ax();
		else if constexpr (data_size == DataSize::DWord)	return context.registers.eax();
	};

	// For the string operations, evaluate to either SI and DI or ESI and EDI, depending on the address size.
	const auto eSI = [&]() -> AddressT& {
		if constexpr (std::is_same_v<AddressT, uint16_t>) {
			return context.registers.si();
		} else {
			return context.registers.esi();
		}
	};
	const auto eDI = [&]() -> AddressT& {
		if constexpr (std::is_same_v<AddressT, uint16_t>) {
			return context.registers.di();
		} else {
			return context.registers.edi();
		}
	};

	// For counts, provide either eCX or CX depending on address size.
	const auto eCX = [&]() -> AddressT& {
		if constexpr (std::is_same_v<AddressT, uint16_t>) {
			return context.registers.cx();
		} else {
			return context.registers.ecx();
		}
	};

	// Gets the port for an IN or OUT; these are always 16-bit.
	const auto port = [&](Source source) -> uint16_t {
		switch(source) {
			case Source::DirectAddress:	return instruction.offset();
			default:					return context.registers.dx();
		}
	};

	// Guide to the below:
	//
	//	* use hard-coded register names where appropriate, otherwise use the source_X() and destination_X() lambdas;
	//	* return directly if there is definitely no possible write back to RAM;
	//	* break if there's a chance of writeback.
	switch(instruction.operation()) {
		default:
			assert(false);

		case Operation::Invalid:
			// TODO: throw on higher-order processors.
		case Operation::ESC:
		case Operation::NOP:	return;

		case Operation::AAM:	Primitive::aam(context.registers.axp(), uint8_t(instruction.operand()), context);	return;
		case Operation::AAD:	Primitive::aad(context.registers.axp(), uint8_t(instruction.operand()), context);	return;
		case Operation::AAA:	Primitive::aaas<true>(context.registers.axp(), context);					return;
		case Operation::AAS:	Primitive::aaas<false>(context.registers.axp(), context);					return;
		case Operation::DAA:	Primitive::daas<true>(context.registers.al(), context);						return;
		case Operation::DAS:	Primitive::daas<false>(context.registers.al(), context);					return;

		case Operation::CBW:	Primitive::cbw(pair_low());					return;
		case Operation::CWD:	Primitive::cwd(pair_high(), pair_low());	return;

		case Operation::HLT:	context.flow_controller.halt();		return;
		case Operation::WAIT:	context.flow_controller.wait();		return;

		case Operation::ADC:
			Primitive::add<true, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::ADD:
			Primitive::add<false, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::SBB:
			Primitive::sub<true, AccessType::ReadModifyWrite, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::SUB:
			Primitive::sub<false, AccessType::ReadModifyWrite, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::CMP:
			Primitive::sub<false, AccessType::Read, IntT>(destination_r(), source_r(), context);
		return;
		case Operation::TEST:
			Primitive::test<IntT>(destination_r(), source_r(), context);
		return;

		case Operation::MUL:		Primitive::mul<IntT>(pair_high(), pair_low(), source_r(), context);			return;
		case Operation::IMUL_1:		Primitive::imul<IntT>(pair_high(), pair_low(), source_r(), context);		return;
		case Operation::DIV:		Primitive::div<IntT>(pair_high(), pair_low(), source_r(), context);			return;
		case Operation::IDIV:		Primitive::idiv<false, IntT>(pair_high(), pair_low(), source_r(), context);	return;
		case Operation::IDIV_REP:
			if constexpr (ContextT::model == Model::i8086) {
				Primitive::idiv<true, IntT>(pair_high(), pair_low(), source_r(), context);
				break;
			} else {
				static_assert(int(Operation::IDIV_REP) == int(Operation::LEAVE));
				if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
					Primitive::leave<IntT>();
				}
			}
		return;

		case Operation::INC:	Primitive::inc<IntT>(destination_rmw(), context);		break;
		case Operation::DEC:	Primitive::dec<IntT>(destination_rmw(), context);		break;

		case Operation::AND:	Primitive::and_<IntT>(destination_rmw(), source_r(), context);		break;
		case Operation::OR:		Primitive::or_<IntT>(destination_rmw(), source_r(), context);		break;
		case Operation::XOR:	Primitive::xor_<IntT>(destination_rmw(), source_r(), context);		break;
		case Operation::NEG:	Primitive::neg<IntT>(source_rmw(), context);						break;	// TODO: should be a destination.
		case Operation::NOT:	Primitive::not_<IntT>(source_rmw());								break;	// TODO: should be a destination.

		case Operation::CALLrel:
			Primitive::call_relative<AddressT>(instruction.displacement(), context);
		return;
		case Operation::CALLabs:	Primitive::call_absolute<IntT, AddressT>(destination_r(), context);					return;
		case Operation::CALLfar:	Primitive::call_far<AddressT>(instruction, context);									return;

		case Operation::JMPrel:	jcc(true);														return;
		case Operation::JMPabs:	Primitive::jump_absolute<IntT>(destination_r(), context);		return;
		case Operation::JMPfar:	Primitive::jump_far(instruction, context);						return;

		case Operation::JCXZ:	jcc(!eCX());														return;
		case Operation::LOOP:	Primitive::loop<AddressT>(eCX(), instruction.offset(), context);	return;
		case Operation::LOOPE:	Primitive::loope<AddressT>(eCX(), instruction.offset(), context);	return;
		case Operation::LOOPNE:	Primitive::loopne<AddressT>(eCX(), instruction.offset(), context);	return;

		case Operation::IRET:		Primitive::iret(context);					return;
		case Operation::RETnear:	Primitive::ret_near(instruction, context);	return;
		case Operation::RETfar:		Primitive::ret_far(instruction, context);	return;

		case Operation::INT:	interrupt(instruction.operand(), context);		return;
		case Operation::INTO:	Primitive::into(context);						return;

		case Operation::SAHF:	Primitive::sahf(context.registers.ah(), context);		return;
		case Operation::LAHF:	Primitive::lahf(context.registers.ah(), context);		return;

		case Operation::LDS:
			if constexpr (data_size == DataSize::Word) {
				Primitive::ld<Source::DS>(instruction, destination_w(), context);
				context.segments.did_update(Source::DS);
			}
		return;
		case Operation::LES:
			if constexpr (data_size == DataSize::Word) {
				Primitive::ld<Source::ES>(instruction, destination_w(), context);
				context.segments.did_update(Source::ES);
			}
		return;

		case Operation::LEA:	Primitive::lea<IntT>(instruction, destination_w(), context);	return;
		case Operation::MOV:
			Primitive::mov<IntT>(destination_w(), source_r());
			if constexpr (std::is_same_v<IntT, uint16_t>) {
				context.segments.did_update(instruction.destination().source());
			}
		break;

		case Operation::JO:		jcc(context.flags.template condition<Condition::Overflow>());		return;
		case Operation::JNO:	jcc(!context.flags.template condition<Condition::Overflow>());		return;
		case Operation::JB:		jcc(context.flags.template condition<Condition::Below>());			return;
		case Operation::JNB:	jcc(!context.flags.template condition<Condition::Below>());			return;
		case Operation::JZ:		jcc(context.flags.template condition<Condition::Zero>());			return;
		case Operation::JNZ:	jcc(!context.flags.template condition<Condition::Zero>());			return;
		case Operation::JBE:	jcc(context.flags.template condition<Condition::BelowOrEqual>());	return;
		case Operation::JNBE:	jcc(!context.flags.template condition<Condition::BelowOrEqual>());	return;
		case Operation::JS:		jcc(context.flags.template condition<Condition::Sign>());			return;
		case Operation::JNS:	jcc(!context.flags.template condition<Condition::Sign>());			return;
		case Operation::JP:		jcc(!context.flags.template condition<Condition::ParityOdd>());		return;
		case Operation::JNP:	jcc(context.flags.template condition<Condition::ParityOdd>());		return;
		case Operation::JL:		jcc(context.flags.template condition<Condition::Less>());			return;
		case Operation::JNL:	jcc(!context.flags.template condition<Condition::Less>());			return;
		case Operation::JLE:	jcc(context.flags.template condition<Condition::LessOrEqual>());	return;
		case Operation::JNLE:	jcc(!context.flags.template condition<Condition::LessOrEqual>());	return;

		case Operation::RCL:	Primitive::rcl<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::RCR:	Primitive::rcr<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::ROL:	Primitive::rol<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::ROR:	Primitive::ror<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::SAL:	Primitive::sal<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::SAR:	Primitive::sar<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::SHR:	Primitive::shr<IntT>(destination_rmw(), shift_count(), context);	break;

		case Operation::CLC:	Primitive::clc(context);				return;
		case Operation::CLD:	Primitive::cld(context);				return;
		case Operation::CLI:	Primitive::cli(context);				return;
		case Operation::STC:	Primitive::stc(context);				return;
		case Operation::STD:	Primitive::std(context);				return;
		case Operation::STI:	Primitive::sti(context);				return;
		case Operation::CMC:	Primitive::cmc(context);				return;

		case Operation::XCHG:	Primitive::xchg<IntT>(destination_rmw(), source_rmw());		break;

		case Operation::SALC:	Primitive::salc(context.registers.al(), context);			return;
		case Operation::SETMO:
			if constexpr (ContextT::model == Model::i8086) {
				Primitive::setmo<IntT>(destination_w(), context);
				break;
			} else {
				static_assert(int(Operation::SETMO) == int(Operation::ENTER));
				Primitive::enter<IntT>(instruction, context);
			}
		return;
		case Operation::SETMOC:
			if constexpr (ContextT::model == Model::i8086) {
				// Test CL out here to avoid taking a reference to memory if
				// no write is going to occur.
				if(context.registers.cl()) {
					Primitive::setmo<IntT>(destination_w(), context);
				}
				break;
			} else {
				static_assert(int(Operation::SETMOC) == int(Operation::BOUND));
				Primitive::bound<IntT>(instruction, destination_r(), source_r(), context);
			}
		return;

		case Operation::OUT: Primitive::out<IntT>(port(instruction.destination().source()), pair_low(), context);	return;
		case Operation::IN:	 Primitive::in<IntT>(port(instruction.source().source()), pair_low(), context);			return;

		case Operation::XLAT:	Primitive::xlat<AddressT>(instruction, context);		return;

		case Operation::POP:
			destination_w() = Primitive::pop<IntT, false>(context);
			if constexpr (std::is_same_v<IntT, uint16_t>) {
				context.segments.did_update(instruction.destination().source());
			}
		break;
		case Operation::PUSH:
			Primitive::push<IntT, false>(source_rmw(), context);	// PUSH SP modifies SP before pushing it;
																	// hence PUSH is sometimes read-modify-write.
		break;

		case Operation::POPF:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::popf(context);
			}
		return;
		case Operation::PUSHF:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::pushf(context);
			}
		return;
		case Operation::POPA:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::popa<IntT>(context);
			}
		return;
		case Operation::PUSHA:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::pusha<IntT>(context);
			}
		return;

		case Operation::CMPS:
			Primitive::cmps<IntT, AddressT, Repetition::None>(instruction, eCX(), eSI(), eDI(), context);
		return;
		case Operation::CMPS_REPE:
			Primitive::cmps<IntT, AddressT, Repetition::RepE>(instruction, eCX(), eSI(), eDI(), context);
		return;
		case Operation::CMPS_REPNE:
			Primitive::cmps<IntT, AddressT, Repetition::RepNE>(instruction, eCX(), eSI(), eDI(), context);
		return;

		case Operation::SCAS:
			Primitive::scas<IntT, AddressT, Repetition::None>(eCX(), eDI(), pair_low(), context);
		return;
		case Operation::SCAS_REPE:
			Primitive::scas<IntT, AddressT, Repetition::RepE>(eCX(), eDI(), pair_low(), context);
		return;
		case Operation::SCAS_REPNE:
			Primitive::scas<IntT, AddressT, Repetition::RepNE>(eCX(), eDI(), pair_low(), context);
		return;

		case Operation::LODS:
			Primitive::lods<IntT, AddressT, Repetition::None>(instruction, eCX(), eSI(), pair_low(), context);
		return;
		case Operation::LODS_REP:
			Primitive::lods<IntT, AddressT, Repetition::Rep>(instruction, eCX(), eSI(), pair_low(), context);
		return;

		case Operation::MOVS:
			Primitive::movs<IntT, AddressT, Repetition::None>(instruction, eCX(), eSI(), eDI(), context);
		break;
		case Operation::MOVS_REP:
			Primitive::movs<IntT, AddressT, Repetition::Rep>(instruction, eCX(), eSI(), eDI(), context);
		break;

		case Operation::STOS:
			Primitive::stos<IntT, AddressT, Repetition::None>(eCX(), eDI(), pair_low(), context);
		break;
		case Operation::STOS_REP:
			Primitive::stos<IntT, AddressT, Repetition::Rep>(eCX(), eDI(), pair_low(), context);
		break;

		case Operation::OUTS:
			Primitive::outs<IntT, AddressT, Repetition::None>(instruction, eCX(), context.registers.dx(), eSI(), context);
		return;
		case Operation::OUTS_REP:
			Primitive::outs<IntT, AddressT, Repetition::Rep>(instruction, eCX(), context.registers.dx(), eSI(), context);
		return;

		case Operation::INS:
			Primitive::ins<IntT, AddressT, Repetition::None>(eCX(), context.registers.dx(), eDI(), context);
		break;
		case Operation::INS_REP:
			Primitive::ins<IntT, AddressT, Repetition::Rep>(eCX(), context.registers.dx(), eDI(), context);
		break;
	}

	// Write to memory if required to complete this operation.
	//
	// This is not currently handled via RAII because of the amount of context that would need to place onto the stack;
	// instead code has been set up to make sure there is only at most one writeable target on loan for potential
	// write back. I might flip-flop on this, especially if I can verify whether extra stack context is easily
	// optimised out.
	context.memory.template write_back<IntT>();
}